

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O3

int allphone_search_step(ps_search_t *search,int frame_idx)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  acmod_t *acmod_00;
  bin_mdef_t *pbVar4;
  cmd_ln_t *pcVar5;
  int32 iVar6;
  int iVar7;
  _func_int_ps_search_t_ptr *p_Var8;
  undefined8 *puVar9;
  long *plVar10;
  long *plVar11;
  uint uVar12;
  int iVar13;
  int n;
  ps_latlink_t *ppVar14;
  long lVar15;
  hmm_t *phVar16;
  acmod_t *acmod;
  short sVar17;
  int local_70;
  int local_5c;
  int32 local_58;
  int32 local_54;
  cmd_ln_t *local_50;
  bin_mdef_t *local_48;
  ps_search_t *local_40;
  ps_latlink_t *local_38;
  
  acmod_00 = search->acmod;
  local_5c = frame_idx;
  if (acmod_00->compallsen == '\0') {
    pbVar4 = acmod_00->mdef;
    acmod_clear_active(acmod_00);
    iVar7 = pbVar4->n_ciphone;
    if (0 < iVar7) {
      lVar15 = 0;
      do {
        phVar16 = (hmm_t *)(&(search[1].pls)->vt)[lVar15];
        if (phVar16 != (hmm_t *)0x0) {
          do {
            if (phVar16->frame == *(int *)&search[1].d2p) {
              acmod_activate_hmm(acmod_00,phVar16);
            }
            phVar16 = *(hmm_t **)(phVar16[1].score + 4);
          } while (phVar16 != (hmm_t *)0x0);
          iVar7 = pbVar4->n_ciphone;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < iVar7);
    }
  }
  p_Var8 = (_func_int_ps_search_t_ptr *)acmod_score(acmod_00,&local_5c);
  *(int *)&search[1].dag = *(int *)&search[1].dag + acmod_00->n_senone_active;
  local_48 = search->acmod->mdef;
  local_40 = search[1].pls;
  (search[1].vt)->finish = p_Var8;
  iVar7 = local_48->n_ciphone;
  iVar13 = -0x20000000;
  if (0 < iVar7) {
    uVar12 = 0;
    sVar17 = 0;
    do {
      phVar16 = (hmm_t *)(&local_40->vt)[uVar12];
      if (phVar16 != (hmm_t *)0x0) {
        do {
          if (phVar16->frame == *(int *)&search[1].d2p) {
            piVar1 = (int *)((long)&search[1].hyp_str + 4);
            *piVar1 = *piVar1 + 1;
            iVar6 = hmm_vit_eval(phVar16);
            if (iVar13 < iVar6) {
              iVar13 = iVar6;
            }
          }
          phVar16 = *(hmm_t **)(phVar16[1].score + 4);
        } while (phVar16 != (hmm_t *)0x0);
        iVar7 = local_48->n_ciphone;
      }
      sVar17 = sVar17 + 1;
      uVar12 = (uint)sVar17;
    } while ((int)uVar12 < iVar7);
    local_40 = search[1].pls;
    local_48 = search->acmod->mdef;
    iVar7 = local_48->n_ciphone;
  }
  iVar2 = *(int *)&search[1].d2p;
  local_70 = iVar2 + 1;
  if (0 < iVar7) {
    ppVar14 = search[1].last_link;
    n = *(int *)&ppVar14->best_prev;
    iVar3 = *(int *)((long)&search[1].acmod + 4);
    local_50 = search[1].config;
    uVar12 = 0;
    sVar17 = 0;
    local_38 = ppVar14;
    do {
      phVar16 = (hmm_t *)(&local_40->vt)[uVar12];
      if (phVar16 != (hmm_t *)0x0) {
        do {
          if (phVar16->frame == iVar2) {
            if (phVar16->bestscore < iVar3 + iVar13) {
              hmm_clear(phVar16);
            }
            else {
              puVar9 = (undefined8 *)
                       __ckd_calloc__(1,0x18,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                      ,0x197);
              *(int *)(puVar9 + 2) = iVar2;
              *puVar9 = phVar16;
              iVar6 = phVar16->out_history;
              *(int32 *)((long)puVar9 + 0x14) = iVar6;
              *(int32 *)(puVar9 + 1) = phVar16->out_score;
              if (search[1].type == (char *)0x0) {
                *(undefined4 *)((long)puVar9 + 0xc) = *(undefined4 *)((long)&search[1].dict + 4);
              }
              else if (iVar6 < 1) {
                *(undefined4 *)((long)puVar9 + 0xc) = 0;
              }
              else {
                plVar10 = (long *)blkarray_list_get((blkarray_list_t *)ppVar14,iVar6);
                if (*(int *)((long)plVar10 + 0x14) < 1) {
                  iVar7 = ngram_bg_score((ngram_model_t *)search[1].type,
                                         (&local_50->refcount)[*(short *)(*plVar10 + 0x5c)],
                                         (&local_50->refcount)
                                         [*(short *)((long)&phVar16[1].ctx + 4)],&local_58);
                }
                else {
                  plVar11 = (long *)blkarray_list_get((blkarray_list_t *)ppVar14,
                                                      *(int32 *)((long)puVar9 + 0x14));
                  iVar7 = ngram_tg_score((ngram_model_t *)search[1].type,
                                         (&local_50->refcount)[*(short *)(*plVar11 + 0x5c)],
                                         (&local_50->refcount)[*(short *)(*plVar10 + 0x5c)],
                                         (&local_50->refcount)
                                         [*(short *)((long)&phVar16[1].ctx + 4)],&local_58);
                }
                *(int *)((long)puVar9 + 0xc) = iVar7 >> 10;
                ppVar14 = local_38;
              }
              blkarray_list_append((blkarray_list_t *)ppVar14,puVar9);
              phVar16->frame = local_70;
            }
          }
          phVar16 = *(hmm_t **)(phVar16[1].score + 4);
        } while (phVar16 != (hmm_t *)0x0);
        iVar7 = local_48->n_ciphone;
      }
      sVar17 = sVar17 + 1;
      uVar12 = (uint)sVar17;
    } while ((int)uVar12 < iVar7);
    ppVar14 = search[1].last_link;
    local_70 = *(int *)&search[1].d2p + 1;
    if (n < *(int *)&ppVar14->best_prev) {
      pcVar5 = search[1].config;
      do {
        plVar10 = (long *)blkarray_list_get((blkarray_list_t *)ppVar14,n);
        lVar15 = *plVar10;
        for (puVar9 = *(undefined8 **)(lVar15 + 0x78); puVar9 != (undefined8 *)0x0;
            puVar9 = (undefined8 *)puVar9[1]) {
          phVar16 = (hmm_t *)*puVar9;
          if ((ngram_model_t *)search[1].type == (ngram_model_t *)0x0) {
            iVar7 = *(int *)((long)&search[1].dict + 4);
          }
          else {
            if (*(int32 *)((long)plVar10 + 0x14) < 1) {
              iVar7 = ngram_bg_score((ngram_model_t *)search[1].type,
                                     (&pcVar5->refcount)[*(short *)(lVar15 + 0x5c)],
                                     (&pcVar5->refcount)[*(short *)((long)&phVar16[1].ctx + 4)],
                                     &local_54);
            }
            else {
              plVar11 = (long *)blkarray_list_get((blkarray_list_t *)search[1].last_link,
                                                  *(int32 *)((long)plVar10 + 0x14));
              iVar7 = ngram_tg_score((ngram_model_t *)search[1].type,
                                     (&pcVar5->refcount)[*(short *)(*plVar11 + 0x5c)],
                                     (&pcVar5->refcount)[*(short *)(lVar15 + 0x5c)],
                                     (&pcVar5->refcount)[*(short *)((long)&phVar16[1].ctx + 4)],
                                     &local_54);
            }
            iVar7 = iVar7 >> 10;
          }
          iVar7 = iVar7 + (int)plVar10[1];
          if ((*(int *)&search[1].acmod + iVar13 < iVar7) && (phVar16->score[0] < iVar7)) {
            hmm_enter(phVar16,iVar7,n,local_70);
          }
        }
        n = n + 1;
        ppVar14 = search[1].last_link;
      } while (n < *(int *)&ppVar14->best_prev);
      local_70 = *(int *)&search[1].d2p + 1;
    }
  }
  *(int *)&search[1].d2p = local_70;
  return 0;
}

Assistant:

int
allphone_search_step(ps_search_t * search, int frame_idx)
{
    int32 bestscr, frame_history_start;
    const int16 *senscr;
    allphone_search_t *allphs = (allphone_search_t *) search;
    acmod_t *acmod = search->acmod;

    if (!acmod->compallsen)
        allphone_search_sen_active(allphs);
    senscr = acmod_score(acmod, &frame_idx);
    allphs->n_sen_eval += acmod->n_senone_active;
    bestscr = phmm_eval_all(allphs, senscr);

    frame_history_start = blkarray_list_n_valid(allphs->history);
    phmm_exit(allphs, bestscr);
    phmm_trans(allphs, bestscr, frame_history_start);

    allphs->frame++;

    return 0;
}